

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>,void>
               (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *container,ostream *os)

{
  pointer pIVar1;
  long lVar2;
  pointer value;
  
  std::operator<<(os,'{');
  value = (container->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
          _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (container->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar2 = 0;
  do {
    if (value == pIVar1) {
      if (lVar2 != 0) {
LAB_001ecae6:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_001ecae6;
    }
    std::operator<<(os,' ');
    UniversalPrinter<bssl::der::Input>::Print(value,os);
    lVar2 = lVar2 + 1;
    value = value + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }